

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

void __thiscall Person::Person(Person *this,string *i,string *n,Address *ad)

{
  uint uVar1;
  ostream *this_00;
  Address *ad_local;
  string *n_local;
  string *i_local;
  Person *this_local;
  
  this->_vptr_Person = (_func_int **)&PTR_operator__0010ad20;
  std::__cxx11::string::string((string *)&this->id);
  std::__cxx11::string::string((string *)&this->name);
  Address::Address(&this->address);
  std::__cxx11::string::operator=((string *)&this->id,(string *)i);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  Address::operator=(&this->address,ad);
  uVar1 = (*this->_vptr_Person[1])();
  if ((uVar1 & 1) == 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"invalid id");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  return;
}

Assistant:

Person::Person(string i, string n, const Address &ad) {
    id = i;
    name = n;
    address = ad;
    if (!validate()) {
        cout << "invalid id" << endl;
        exit(-1);
    }
}